

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O1

void __thiscall
graphics101::HalfEdgeTriMesh::build
          (HalfEdgeTriMesh *this,unsigned_long num_vertices,
          vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *triangles,
          Edges *edges)

{
  directed_edge2halfedge_index_map_t *this_00;
  pointer *ppHVar1;
  int iVar2;
  iterator __position;
  iterator __position_00;
  pointer pHVar3;
  long lVar4;
  const_iterator __position_01;
  undefined8 uVar5;
  Edges *pEVar6;
  ulong *puVar7;
  ulong uVar8;
  Index IVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  _Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
  *p_Var12;
  mapped_type *pmVar13;
  _Hash_node_base *p_Var14;
  ulong uVar15;
  HalfEdgeIndex *hei;
  pointer pHVar16;
  pointer pTVar17;
  pointer pvVar18;
  pointer pHVar19;
  long lVar20;
  long lVar21;
  HalfEdgeIndex *__v;
  ulong uVar22;
  unordered_map<long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>_>
  vertex2outgoing_boundary_hei;
  HalfEdgeIndices boundary_heis;
  Index originating_vertex;
  directed_edge2index_map_t de2fi;
  undefined1 local_f8 [24];
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  HalfEdgeIndex local_d8;
  undefined1 local_d0 [16];
  undefined1 local_b8 [16];
  HalfEdgeIndex *local_a8;
  vector<graphics101::Triangle,_std::allocator<graphics101::Triangle>_> *local_a0;
  Edges *local_98;
  HalfEdgeIndices *local_90;
  _Base_ptr local_88;
  pointer local_80;
  HalfEdgeIndices *local_78;
  HalfEdgeIndices *local_70;
  Index local_68;
  _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_long>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar17 = (triangles->
            super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_a0 = triangles;
  local_98 = edges;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((triangles->super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>)
      ._M_impl.super__Vector_impl_data._M_finish != pTVar17) {
    lVar20 = 8;
    uVar22 = 0;
    do {
      local_f8._0_8_ = SEXT48(*(int *)((long)pTVar17 + lVar20 + -8));
      local_f8._8_8_ = SEXT48(*(int *)((long)pTVar17 + lVar20 + -4));
      puVar7 = (ulong *)std::
                        map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                        ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                                      *)&local_60,(key_type *)local_f8);
      *puVar7 = uVar22;
      local_f8._0_8_ = SEXT48(*(int *)((long)pTVar17 + lVar20 + -4));
      local_f8._8_8_ = SEXT48(*(int *)((long)&pTVar17->A + lVar20));
      puVar7 = (ulong *)std::
                        map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                        ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                                      *)&local_60,(key_type *)local_f8);
      *puVar7 = uVar22;
      local_f8._0_8_ = SEXT48(*(int *)((long)&pTVar17->A + lVar20));
      local_f8._8_8_ = SEXT48(*(int *)((long)pTVar17 + lVar20 + -8));
      puVar7 = (ulong *)std::
                        map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                        ::operator[]((map<std::pair<long,_long>,_long,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
                                      *)&local_60,(key_type *)local_f8);
      *puVar7 = uVar22;
      uVar22 = uVar22 + 1;
      pTVar17 = (local_a0->
                super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(local_a0->
                     super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar17 >> 2) *
              -0x5555555555555555;
      lVar20 = lVar20 + 0xc;
    } while (uVar22 <= uVar8 && uVar8 - uVar22 != 0);
  }
  clear(this);
  local_70 = &this->m_vertex_halfedges;
  local_f8._0_8_ = -1;
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(local_70,num_vertices,(value_type *)local_f8);
  local_90 = &this->m_face_halfedges;
  local_f8._0_8_ = -1;
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(local_90,((long)(local_a0->
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_a0->
                           super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555,
           (value_type *)local_f8);
  pEVar6 = local_98;
  local_78 = &this->m_edge_halfedges;
  local_f8._0_8_ = 0xffffffffffffffff;
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
  ::resize(local_78,(long)(local_98->
                          super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_98->
                          super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3,(value_type *)local_f8);
  std::
  vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
  ::reserve(&this->m_halfedges,
            (long)(pEVar6->
                  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(pEVar6->
                  super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 2);
  pvVar18 = (pEVar6->
            super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pEVar6->
      super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar18) {
    this_00 = &this->m_directed_edge2he_index;
    local_88 = &(this->m_directed_edge2he_index)._M_t._M_impl.super__Rb_tree_header._M_header;
    uVar22 = 0;
    do {
      __position._M_current =
           (this->m_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pHVar19 = (this->m_halfedges).
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uStack_e0 = 0xffffffff;
      local_f8._16_8_ = 0xffffffffffffffff;
      uStack_dc = 0xffffffff;
      local_f8._0_8_ = -1;
      local_f8._8_8_ = 0xffffffffffffffff;
      local_d8.value = -1;
      if (__position._M_current ==
          (this->m_halfedges).
          super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
        ::_M_realloc_insert<graphics101::HalfEdgeTriMesh::HalfEdge>
                  (&this->m_halfedges,__position,(HalfEdge *)local_f8);
      }
      else {
        *(undefined4 *)&(__position._M_current)->edge = 0xffffffff;
        *(undefined4 *)((long)&(__position._M_current)->edge + 4) = 0xffffffff;
        *(undefined4 *)&((__position._M_current)->opposite_he).value = 0xffffffff;
        *(undefined4 *)((long)&((__position._M_current)->opposite_he).value + 4) = 0xffffffff;
        *(undefined4 *)&(__position._M_current)->to_vertex = 0xffffffff;
        *(undefined4 *)((long)&(__position._M_current)->to_vertex + 4) = 0xffffffff;
        *(undefined4 *)&(__position._M_current)->face = 0xffffffff;
        *(undefined4 *)((long)&(__position._M_current)->face + 4) = 0xffffffff;
        ((__position._M_current)->next_he).value = -1;
        ppHVar1 = &(this->m_halfedges).
                   super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
      __position_00._M_current =
           (this->m_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      pHVar3 = (this->m_halfedges).
               super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uStack_e0 = 0xffffffff;
      local_f8._16_8_ = 0xffffffffffffffff;
      uStack_dc = 0xffffffff;
      local_f8._0_8_ = -1;
      local_f8._8_8_ = 0xffffffffffffffff;
      local_d8.value = -1;
      if (__position_00._M_current ==
          (this->m_halfedges).
          super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
        ::_M_realloc_insert<graphics101::HalfEdgeTriMesh::HalfEdge>
                  (&this->m_halfedges,__position_00,(HalfEdge *)local_f8);
      }
      else {
        *(undefined4 *)&(__position_00._M_current)->edge = 0xffffffff;
        *(undefined4 *)((long)&(__position_00._M_current)->edge + 4) = 0xffffffff;
        *(undefined4 *)&((__position_00._M_current)->opposite_he).value = 0xffffffff;
        *(undefined4 *)((long)&((__position_00._M_current)->opposite_he).value + 4) = 0xffffffff;
        *(undefined4 *)&(__position_00._M_current)->to_vertex = 0xffffffff;
        *(undefined4 *)((long)&(__position_00._M_current)->to_vertex + 4) = 0xffffffff;
        *(undefined4 *)&(__position_00._M_current)->face = 0xffffffff;
        *(undefined4 *)((long)&(__position_00._M_current)->face + 4) = 0xffffffff;
        ((__position_00._M_current)->next_he).value = -1;
        ppHVar1 = &(this->m_halfedges).
                   super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
      local_80 = (this->m_halfedges).
                 super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      IVar9 = anon_unknown.dwarf_a02a9::directed_edge2face_index
                        ((directed_edge2index_map_t *)&local_60,(long)pvVar18[uVar22].field_0.x,
                         (long)pvVar18[uVar22].field_1.y);
      __position_00._M_current[-1].face = IVar9;
      iVar2 = pvVar18[uVar22].field_1.y;
      __position_00._M_current[-1].to_vertex = (long)iVar2;
      __position_00._M_current[-1].edge = uVar22;
      IVar9 = anon_unknown.dwarf_a02a9::directed_edge2face_index
                        ((directed_edge2index_map_t *)&local_60,(long)iVar2,
                         (long)pvVar18[uVar22].field_0.x);
      lVar21 = ((long)__position._M_current - (long)pHVar19 >> 3) * -0x3333333333333333;
      lVar20 = ((long)__position_00._M_current - (long)pHVar3 >> 3) * -0x3333333333333333;
      local_80[-1].face = IVar9;
      local_80[-1].to_vertex = (long)pvVar18[uVar22].field_0.x;
      local_80[-1].edge = uVar22;
      __position_00._M_current[-1].opposite_he.value = lVar20;
      local_80[-1].opposite_he.value = lVar21;
      local_f8._0_8_ = SEXT48(pvVar18[uVar22].field_0.x);
      local_f8._8_8_ = SEXT48(pvVar18[uVar22].field_1.y);
      iVar10 = std::
               _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
               ::find(&this_00->_M_t,(key_type *)local_f8);
      if (iVar10._M_node != local_88) {
        __assert_fail("m_directed_edge2he_index.find( std::make_pair( edge[0], edge[1] ) ) == m_directed_edge2he_index.end()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                      ,0xcc,
                      "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                     );
      }
      local_f8._0_8_ = SEXT48(pvVar18[uVar22].field_1.y);
      local_f8._8_8_ = SEXT48(pvVar18[uVar22].field_0.x);
      iVar10 = std::
               _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
               ::find(&this_00->_M_t,(key_type *)local_f8);
      if (iVar10._M_node != local_88) {
        __assert_fail("m_directed_edge2he_index.find( std::make_pair( edge[1], edge[0] ) ) == m_directed_edge2he_index.end()"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                      ,0xcd,
                      "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                     );
      }
      local_f8._0_8_ = SEXT48(pvVar18[uVar22].field_0.x);
      local_f8._8_8_ = SEXT48(pvVar18[uVar22].field_1.y);
      pmVar11 = std::
                map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                ::operator[](this_00,(key_type *)local_f8);
      pmVar11->value = lVar21;
      local_f8._0_8_ = SEXT48(pvVar18[uVar22].field_1.y);
      local_f8._8_8_ = SEXT48(pvVar18[uVar22].field_0.x);
      pmVar11 = std::
                map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                ::operator[](this_00,(key_type *)local_f8);
      pmVar11->value = lVar20;
      pHVar16 = (local_70->
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((pHVar16[__position_00._M_current[-1].to_vertex].value == -1) || (local_80[-1].face == -1)
         ) {
        pHVar16[__position_00._M_current[-1].to_vertex].value =
             __position_00._M_current[-1].opposite_he.value;
      }
      if ((pHVar16[local_80[-1].to_vertex].value == -1) || (__position_00._M_current[-1].face == -1)
         ) {
        pHVar16[local_80[-1].to_vertex].value = local_80[-1].opposite_he.value;
      }
      lVar4 = __position_00._M_current[-1].face;
      if ((lVar4 != -1) &&
         (pHVar16 = (local_90->
                    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                    )._M_impl.super__Vector_impl_data._M_start, pHVar16[lVar4].value == -1)) {
        pHVar16[lVar4].value = lVar21;
      }
      lVar4 = local_80[-1].face;
      if ((lVar4 != -1) &&
         (pHVar16 = (local_90->
                    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                    )._M_impl.super__Vector_impl_data._M_start, pHVar16[lVar4].value == -1)) {
        pHVar16[lVar4].value = lVar20;
      }
      pHVar16 = (local_78->
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pHVar16[uVar22].value != -1) {
        __assert_fail("m_edge_halfedges[ ei ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                      ,0xef,
                      "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                     );
      }
      pHVar16[uVar22].value = lVar21;
      uVar22 = uVar22 + 1;
      pvVar18 = (local_98->
                super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar22 < (ulong)((long)(local_98->
                                    super__Vector_base<glm::vec<2,_int,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_int,_(glm::qualifier)0>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar18 >> 3
                             ));
  }
  local_b8 = (undefined1  [16])0x0;
  local_a8 = (HalfEdgeIndex *)0x0;
  pHVar19 = (this->m_halfedges).
            super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_halfedges).
      super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar19) {
    lVar20 = 0;
    uVar22 = 0;
    do {
      lVar21 = *(long *)((long)&pHVar19->face + lVar20);
      if (lVar21 == -1) {
        local_f8._0_8_ = uVar22;
        if ((HalfEdgeIndex *)local_b8._8_8_ == local_a8) {
          std::
          vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
          ::_M_realloc_insert<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>
                    ((vector<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                      *)local_b8,(iterator)local_b8._8_8_,(HalfEdgeIndex *)local_f8);
        }
        else {
          *(Index *)local_b8._8_8_ = uVar22;
          local_b8._8_8_ = (HalfEdgeIndex *)(local_b8._8_8_ + 8);
        }
      }
      else {
        pTVar17 = (local_a0->
                  super__Vector_base<graphics101::Triangle,_std::allocator<graphics101::Triangle>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar8 = *(ulong *)((long)&pHVar19->to_vertex + lVar20);
        uVar15 = (long)pTVar17[lVar21].B;
        if (((uVar8 != (long)pTVar17[lVar21].A) &&
            (uVar15 = (long)pTVar17[lVar21].C, uVar8 != (long)pTVar17[lVar21].B)) &&
           (uVar15 = (long)pTVar17[lVar21].A, uVar8 != (long)pTVar17[lVar21].C)) {
          uVar15 = 0xffffffffffffffff;
        }
        if (uVar15 == 0xffffffffffffffff) {
          __assert_fail("-1 != j",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                        ,0x107,
                        "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
                       );
        }
        local_f8._0_8_ = uVar8;
        local_f8._8_8_ = uVar15;
        pmVar11 = std::
                  map<std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>
                  ::operator[](&this->m_directed_edge2he_index,(key_type *)local_f8);
        *(Index *)((long)&(pHVar19->next_he).value + lVar20) = pmVar11->value;
      }
      uVar22 = uVar22 + 1;
      pHVar19 = (this->m_halfedges).
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->m_halfedges).
                     super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar19 >> 3) *
              -0x3333333333333333;
      lVar20 = lVar20 + 0x28;
    } while (uVar22 <= uVar8 && uVar8 - uVar22 != 0);
  }
  local_f8._0_8_ = local_d0 + 8;
  local_f8._8_8_ = 1;
  stack0xffffffffffffff18 = (undefined1  [16])0x0;
  local_d8.value._0_4_ = 0x3f800000;
  local_d0 = (undefined1  [16])0x0;
  uVar5 = local_b8._8_8_;
  if (local_b8._0_8_ != local_b8._8_8_) {
    __v = (HalfEdgeIndex *)local_b8._0_8_;
    do {
      uVar22 = __v->value;
      pHVar19 = (this->m_halfedges).
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->m_halfedges).
                     super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar19 >> 3) *
              -0x3333333333333333;
      if ((uVar8 < uVar22 || uVar8 - uVar22 == 0) ||
         (uVar22 = pHVar19[uVar22].opposite_he.value, uVar8 < uVar22 || uVar8 - uVar22 == 0)) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      local_68 = pHVar19[uVar22].to_vertex;
      p_Var12 = (_Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
                 *)std::__detail::
                   _Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_f8,&local_68);
      std::
      _Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
      ::_M_insert_unique<graphics101::HalfEdgeTriMesh::HalfEdgeIndex_const&>(p_Var12,__v);
      pmVar13 = std::__detail::
                _Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)local_f8,&local_68);
      if (1 < (pmVar13->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Butterfly vertex encountered.\n",0x1e);
      }
      __v = __v + 1;
    } while (__v != (HalfEdgeIndex *)uVar5);
  }
  uVar5 = local_b8._8_8_;
  if (local_b8._0_8_ != local_b8._8_8_) {
    pHVar16 = (pointer)local_b8._0_8_;
    do {
      pHVar19 = (this->m_halfedges).
                super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                ._M_impl.super__Vector_impl_data._M_start + pHVar16->value;
      p_Var12 = (_Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
                 *)std::__detail::
                   _Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)local_f8,&pHVar19->to_vertex);
      if (*(long *)(p_Var12 + 0x28) != 0) {
        __position_01._M_node = *(_Base_ptr *)(p_Var12 + 0x18);
        (pHVar19->next_he).value = *(Index *)(__position_01._M_node + 1);
        std::
        _Rb_tree<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,graphics101::HalfEdgeTriMesh::HalfEdgeIndex,std::_Identity<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>>
        ::erase_abi_cxx11_(p_Var12,__position_01);
      }
      pHVar16 = pHVar16 + 1;
    } while (pHVar16 != (pointer)uVar5);
  }
  p_Var14 = (_Hash_node_base *)local_f8._16_8_;
  while( true ) {
    if (p_Var14 == (_Hash_node_base *)0x0) {
      std::
      _Hashtable<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<long,_std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>,_std::allocator<std::pair<const_long,_std::set<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::less<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_f8);
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_b8._0_8_);
      }
      std::
      _Rb_tree<std::pair<long,_long>,_std::pair<const_std::pair<long,_long>,_long>,_std::_Select1st<std::pair<const_std::pair<long,_long>,_long>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_long>_>_>
      ::~_Rb_tree(&local_60);
      return;
    }
    if (p_Var14[7]._M_nxt != (_Hash_node_base *)0x0) break;
    p_Var14 = p_Var14->_M_nxt;
  }
  __assert_fail("it.second.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/yig[P]graphics101-meshes/src/halfedge.cpp"
                ,0x12a,
                "void graphics101::HalfEdgeTriMesh::build(const unsigned long, const std::vector<Triangle> &, const Edges &)"
               );
}

Assistant:

void HalfEdgeTriMesh::build( const unsigned long num_vertices, const std::vector< Triangle >& triangles, const Edges& edges )
{
    /*
    Generates all half edge data structures for the mesh given by its vertices 'self.vs'
    and faces 'self.faces'.

    Python version used heavily
    */

    directed_edge2index_map_t de2fi;
    for( int fi = 0; fi < triangles.size(); ++fi )
    {
        const Triangle& tri = triangles[fi];
        de2fi[ std::make_pair( tri[0], tri[1] ) ] = fi;
        de2fi[ std::make_pair( tri[1], tri[2] ) ] = fi;
        de2fi[ std::make_pair( tri[2], tri[0] ) ] = fi;
    }

    // Clear any previous data we store.
    clear();
    m_vertex_halfedges.resize( num_vertices, HalfEdgeIndex(-1) );
    m_face_halfedges.resize( triangles.size(), HalfEdgeIndex(-1) );
    m_edge_halfedges.resize( edges.size(), HalfEdgeIndex(-1) );
    m_halfedges.reserve( edges.size()*2 );

    for( int ei = 0; ei < edges.size(); ++ei )
    {
        const Edge& edge = edges[ei];

        // Add the HalfEdge structures to the end of the list.
        const HalfEdgeIndex he0index( m_halfedges.size() );
        m_halfedges.push_back( HalfEdge() );
        HalfEdge& he0 = m_halfedges.back();

        const HalfEdgeIndex he1index( m_halfedges.size() );
        m_halfedges.push_back( HalfEdge() );
        HalfEdge& he1 = m_halfedges.back();

        // The face will be -1 if it is a boundary half-edge.
        he0.face = directed_edge2face_index( de2fi, edge[0], edge[1] );
        he0.to_vertex = edge[1];
        he0.edge = ei;

        // The face will be -1 if it is a boundary half-edge.
        he1.face = directed_edge2face_index( de2fi, edge[1], edge[0] );
        he1.to_vertex = edge[0];
        he1.edge = ei;

        // Store the opposite half-edge index.
        he0.opposite_he = he1index;
        he1.opposite_he = he0index;

        // Also store the index in our m_directed_edge2he_index map.
        assert( m_directed_edge2he_index.find( std::make_pair( edge[0], edge[1] ) ) == m_directed_edge2he_index.end() );
        assert( m_directed_edge2he_index.find( std::make_pair( edge[1], edge[0] ) ) == m_directed_edge2he_index.end() );
        m_directed_edge2he_index[ std::make_pair( edge[0], edge[1] ) ] = he0index;
        m_directed_edge2he_index[ std::make_pair( edge[1], edge[0] ) ] = he1index;

        // If the vertex pointed to by a half-edge doesn't yet have an out-going
        // halfedge, store the opposite halfedge.
        // Also, if the vertex is a boundary vertex, make sure its
        // out-going halfedge is a boundary halfedge.
        // NOTE: Halfedge data structure can't properly handle butterfly vertices.
        //       If the mesh has butterfly vertices, there will be multiple outgoing
        //       boundary halfedges.  Because we have to pick one as the vertex's outgoing
        //       halfedge, we can't iterate over all neighbors, only a single wing of the
        //       butterfly.
        if( m_vertex_halfedges[ he0.to_vertex ] == -1 || -1 == he1.face )
        {
            m_vertex_halfedges[ he0.to_vertex ] = he0.opposite_he;
        }
        if( m_vertex_halfedges[ he1.to_vertex ] == -1 || -1 == he0.face )
        {
            m_vertex_halfedges[ he1.to_vertex ] = he1.opposite_he;
        }

        // If the face pointed to by a half-edge doesn't yet have a
        // halfedge pointing to it, store the halfedge.
        if( -1 != he0.face && m_face_halfedges[ he0.face ] == -1 )
        {
            m_face_halfedges[ he0.face ] = he0index;
        }
        if( -1 != he1.face && m_face_halfedges[ he1.face ] == -1 )
        {
            m_face_halfedges[ he1.face ] = he1index;
        }

        // Store one of the half-edges for the edge.
        assert( m_edge_halfedges[ ei ] == -1 );
        m_edge_halfedges[ ei ] = he0index;
    }

    // Now that all the half-edges are created, set the remaining next_he field.
    // We can't yet handle boundary halfedges, so store them for later.
    HalfEdgeIndices boundary_heis;
    for( int hei = 0; hei < m_halfedges.size(); ++hei )
    {
        HalfEdge& he = m_halfedges.at( hei );
        // Store boundary halfedges for later.
        if( -1 == he.face )
        {
            boundary_heis.push_back( HalfEdgeIndex( hei ) );
            continue;
        }

        const Triangle& face = triangles[ he.face ];
        const Index i = he.to_vertex;

        Index j = -1;
        if( face[0] == i ) j = face[1];
        else if( face[1] == i ) j = face[2];
        else if( face[2] == i ) j = face[0];
        assert( -1 != j );

        he.next_he = m_directed_edge2he_index[ std::make_pair(i,j) ];
    }

    // Make a map from vertices to boundary halfedges (indices) originating from them.
    // NOTE: There will only be multiple originating boundary halfedges at butterfly vertices.
    std::unordered_map< Index, std::set< HalfEdgeIndex > > vertex2outgoing_boundary_hei;
    for( const auto& hei : boundary_heis )
    {
        const Index originating_vertex = halfedge( halfedge( hei ).opposite_he ).to_vertex;
        vertex2outgoing_boundary_hei[ originating_vertex ].insert( hei );
        if( vertex2outgoing_boundary_hei[ originating_vertex ].size() > 1 )
        {
            std::cerr << "Butterfly vertex encountered.\n";
        }
    }

    // For each boundary halfedge, make its next_he one of the boundary halfedges
    // originating at its to_vertex.
    for( const auto& hei : boundary_heis )
    {
        HalfEdge& he = m_halfedges[ hei ];

        auto& outgoing = vertex2outgoing_boundary_hei[ he.to_vertex ];
        if( !outgoing.empty() )
        {
            auto outgoing_hei = outgoing.begin();
            he.next_he = *outgoing_hei;

            outgoing.erase( outgoing_hei );
        }
    }

#ifndef NDEBUG
    for( const auto& it : vertex2outgoing_boundary_hei ) { assert( it.second.empty() ); }
#endif
}